

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::App::get_option(App *this,string *option_name)

{
  Option *pOVar1;
  undefined8 uVar2;
  string *in_RSI;
  string *unaff_retaddr;
  App *in_stack_00000008;
  Option *opt;
  string local_58 [16];
  string *in_stack_ffffffffffffffb8;
  OptionNotFound *in_stack_ffffffffffffffc0;
  string local_38 [32];
  Option *local_18;
  
  ::std::__cxx11::string::string(local_38,in_RSI);
  pOVar1 = get_option_no_throw(in_stack_00000008,unaff_retaddr);
  ::std::__cxx11::string::~string(local_38);
  if (pOVar1 == (Option *)0x0) {
    local_18 = pOVar1;
    uVar2 = __cxa_allocate_exception(0x38);
    ::std::__cxx11::string::string(local_58,in_RSI);
    OptionNotFound::OptionNotFound(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __cxa_throw(uVar2,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
  }
  return pOVar1;
}

Assistant:

CLI11_NODISCARD const Option *get_option(std::string option_name) const {
        const auto *opt = get_option_no_throw(option_name);
        if(opt == nullptr) {
            throw OptionNotFound(option_name);
        }
        return opt;
    }